

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters.cpp
# Opt level: O0

BoxFilter * pbrt::BoxFilter::Create(ParameterDictionary *parameters,FileLoc *loc,Allocator alloc)

{
  BoxFilter *pBVar1;
  ParameterDictionary *in_RDI;
  Float FVar2;
  Float x;
  Float yw;
  Float xw;
  float in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  ParameterDictionary *in_stack_ffffffffffffff50;
  Vector2<float> *args;
  undefined4 in_stack_ffffffffffffff60;
  allocator<char> *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  allocator<char> local_41;
  string local_40 [36];
  Float local_1c;
  ParameterDictionary *local_10;
  
  local_10 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  FVar2 = ParameterDictionary::GetOneFloat
                    (in_stack_ffffffffffffff50,
                     (string *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),0.0);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  args = (Vector2<float> *)&stack0xffffffffffffff87;
  local_1c = FVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  x = ParameterDictionary::GetOneFloat
                (local_10,(string *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                 0.0);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff88);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff87);
  Vector2<float>::Vector2((Vector2<float> *)local_10,x,in_stack_ffffffffffffff48);
  pBVar1 = pstd::pmr::polymorphic_allocator<std::byte>::
           new_object<pbrt::BoxFilter,pbrt::Vector2<float>>
                     ((polymorphic_allocator<std::byte> *)CONCAT44(FVar2,in_stack_ffffffffffffff60),
                      args);
  return pBVar1;
}

Assistant:

BoxFilter *BoxFilter::Create(const ParameterDictionary &parameters, const FileLoc *loc,
                             Allocator alloc) {
    Float xw = parameters.GetOneFloat("xradius", 0.5f);
    Float yw = parameters.GetOneFloat("yradius", 0.5f);
    return alloc.new_object<BoxFilter>(Vector2f(xw, yw));
}